

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::StringTree::concat<kj::StringTree,kj::StringTree,kj::StringTree>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          StringTree *params_1,StringTree *params_2)

{
  size_t sVar1;
  StringTree *pSVar2;
  char *pos;
  StringTree *rest;
  StringTree *rest_1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  size_t local_e8;
  size_t local_e0;
  size_t local_d8;
  _ *local_d0;
  undefined8 local_c8;
  Array<kj::StringTree::Branch> local_c0;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  _ *local_90;
  undefined8 local_88;
  String local_80;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  _ *local_40;
  undefined8 local_38;
  undefined1 local_29;
  StringTree *local_28;
  StringTree *params_local_2;
  StringTree *params_local_1;
  StringTree *params_local;
  StringTree *result;
  
  local_29 = 0;
  local_28 = params_1;
  params_local_2 = params;
  params_local_1 = this;
  params_local = __return_storage_ptr__;
  StringTree(__return_storage_ptr__);
  local_58 = size(params_local_1);
  local_50 = size(params_local_2);
  local_48 = size(local_28);
  local_40 = (_ *)&local_58;
  local_38 = 3;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x3;
  sVar1 = _::sum(local_40,nums);
  __return_storage_ptr__->size_ = sVar1;
  pSVar2 = fwd<kj::StringTree>(params_local_1);
  local_a8 = flatSize(pSVar2);
  pSVar2 = fwd<kj::StringTree>(params_local_2);
  local_a0 = flatSize(pSVar2);
  pSVar2 = fwd<kj::StringTree>(local_28);
  local_98 = flatSize(pSVar2);
  local_90 = (_ *)&local_a8;
  local_88 = 3;
  nums_00._M_len = extraout_RDX_00;
  nums_00._M_array = (iterator)0x3;
  sVar1 = _::sum(local_90,nums_00);
  heapString(&local_80,sVar1);
  String::operator=(&__return_storage_ptr__->text,&local_80);
  String::~String(&local_80);
  pSVar2 = fwd<kj::StringTree>(params_local_1);
  local_e8 = branchCount(pSVar2);
  pSVar2 = fwd<kj::StringTree>(params_local_2);
  local_e0 = branchCount(pSVar2);
  pSVar2 = fwd<kj::StringTree>(local_28);
  local_d8 = branchCount(pSVar2);
  local_d0 = (_ *)&local_e8;
  local_c8 = 3;
  nums_01._M_len = extraout_RDX_01;
  nums_01._M_array = (iterator)0x3;
  sVar1 = _::sum(local_d0,nums_01);
  heapArray<kj::StringTree::Branch>(&local_c0,sVar1);
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_c0);
  Array<kj::StringTree::Branch>::~Array(&local_c0);
  pos = String::begin(&__return_storage_ptr__->text);
  pSVar2 = fwd<kj::StringTree>(params_local_1);
  rest = fwd<kj::StringTree>(params_local_2);
  rest_1 = fwd<kj::StringTree>(local_28);
  fill<kj::StringTree,kj::StringTree>(__return_storage_ptr__,pos,0,pSVar2,rest,rest_1);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}